

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

int repack_q4_0_to_q4_0_4_bl(ggml_tensor *t,int interleave_block,void *data,size_t data_size)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  undefined8 *puVar15;
  long lVar16;
  undefined8 uVar17;
  int iVar18;
  undefined1 (*pauVar19) [64];
  undefined1 (*pauVar20) [64];
  int i;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar24 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  block_q4_0x4 out;
  block_q4_0 dst_tmp [4];
  undefined1 local_c0 [64];
  undefined8 uStack_80;
  undefined8 local_78 [2];
  undefined2 auStack_68 [28];
  
  if (t->type == GGML_TYPE_Q4_0) {
    if ((interleave_block == 4) || (interleave_block == 8)) {
      pauVar19 = (undefined1 (*) [64])t->data;
      iVar9 = ggml_nrows(t);
      uVar22 = t->ne[0];
      uVar14 = uVar22 + 0x1f;
      if (-1 < (long)uVar22) {
        uVar14 = uVar22;
      }
      iVar13 = (int)((long)uVar14 >> 5);
      if ((long)(iVar9 * iVar13) * 0x12 == data_size) {
        iVar18 = -1;
        if ((uVar22 & 7) == 0 && (t->ne[1] & 3U) == 0) {
          if (0 < iVar9) {
            auVar5 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
            auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar28 = vpbroadcastq_avx512f(ZEXT816(3));
            auVar44._8_4_ = 0xfffffff8;
            auVar44._0_8_ = 0xfffffff8fffffff8;
            auVar44._12_4_ = 0xfffffff8;
            auVar44._16_4_ = 0xfffffff8;
            auVar44._20_4_ = 0xfffffff8;
            auVar44._24_4_ = 0xfffffff8;
            auVar44._28_4_ = 0xfffffff8;
            auVar29 = vpbroadcastq_avx512f(ZEXT816(0x12));
            auVar30 = vpbroadcastq_avx512f(ZEXT816(0x8888888888888888));
            auVar31 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar45._8_4_ = 8;
            auVar45._0_8_ = 0x800000008;
            auVar45._12_4_ = 8;
            auVar45._16_4_ = 8;
            auVar45._20_4_ = 8;
            auVar45._24_4_ = 8;
            auVar45._28_4_ = 8;
            auVar32 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar33 = vpbroadcastq_avx512f(ZEXT816(0x7ffffffc));
            auVar34 = vpbroadcastd_avx512f(ZEXT416(0x88888888));
            auVar35 = vpbroadcastq_avx512f(ZEXT816(0x10));
            lVar16 = (long)iVar13;
            iVar18 = 0;
            auVar36 = vpbroadcastq_avx512f();
            do {
              if (0 < lVar16) {
                iVar7 = 0x40U / (uint)interleave_block + (uint)(0x40U / (uint)interleave_block == 0)
                ;
                lVar23 = 0;
                auVar37 = vpbroadcastq_avx512f();
                puVar15 = (undefined8 *)data;
                pauVar20 = pauVar19;
                do {
                  lVar21 = 0;
                  puVar10 = puVar15;
                  do {
                    uVar17 = *puVar10;
                    uVar8 = puVar10[1];
                    puVar11 = puVar10 + 2;
                    puVar10 = (undefined8 *)((long)puVar10 + lVar16 * 0x12);
                    *(undefined2 *)((long)auStack_68 + lVar21) = *(undefined2 *)puVar11;
                    *(undefined8 *)((long)local_78 + lVar21) = uVar17;
                    *(undefined8 *)((long)local_78 + lVar21 + 8) = uVar8;
                    lVar21 = lVar21 + 0x12;
                  } while (lVar21 != 0x48);
                  lVar21 = 0;
                  puVar10 = local_78;
                  do {
                    puVar11 = puVar10;
                    *(undefined2 *)(local_c0 + lVar21 * 2) = *(undefined2 *)puVar11;
                    lVar21 = lVar21 + 1;
                    puVar10 = (undefined8 *)((long)puVar11 + 0x12);
                  } while (lVar21 != 4);
                  if (interleave_block == 8) {
                    uVar22 = 0;
                    auVar38 = vmovdqa64_avx512f(auVar27);
                    auVar25 = auVar5;
                    do {
                      auVar26 = vpaddd_avx512vl(auVar25,auVar25);
                      auVar39 = vpandq_avx512f(auVar38,auVar28);
                      uVar14 = vpcmpuq_avx512f(auVar38,auVar37,2);
                      auVar38 = vpaddq_avx512f(auVar38,auVar31);
                      auVar25 = vpaddd_avx2(auVar25,auVar45);
                      auVar26 = vpandd_avx512vl(auVar26,auVar44);
                      auVar39 = vpmuldq_avx512f(auVar39,auVar29);
                      auVar40 = vpmovsxdq_avx512f(auVar26);
                      auVar39 = vpaddq_avx512f(auVar36,auVar39);
                      vpaddq_avx512f(auVar39,auVar40);
                      auVar24 = vpxord_avx512vl(auVar40._0_16_,auVar40._0_16_);
                      auVar40 = vpgatherqq_avx512f(*(undefined8 *)((long)puVar11 + 0x14));
                      bVar1 = (bool)((byte)uVar14 & 1);
                      auVar39._0_8_ = (ulong)bVar1 * auVar40._0_8_ | (ulong)!bVar1 * auVar24._0_8_;
                      bVar1 = (bool)((byte)(uVar14 >> 1) & 1);
                      auVar39._8_8_ = (ulong)bVar1 * auVar40._8_8_ | (ulong)!bVar1 * auVar24._8_8_;
                      auVar39._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * auVar40._16_8_;
                      auVar39._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * auVar40._24_8_;
                      auVar39._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * auVar40._32_8_;
                      auVar39._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * auVar40._40_8_;
                      auVar39._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * auVar40._48_8_;
                      auVar39._56_8_ = (uVar14 >> 7) * auVar40._56_8_;
                      auVar39 = vpxorq_avx512f(auVar39,auVar30);
                      auVar39 = vmovdqu64_avx512f(auVar39);
                      *(undefined1 (*) [64])(local_c0 + uVar22 * 8 + 8) = auVar39;
                      uVar22 = uVar22 + 8;
                    } while ((iVar7 + 7U & 0xf8) != uVar22);
                  }
                  else {
                    if (interleave_block != 4) {
                      pcVar12 = "false";
                      uVar17 = 0x1635;
                      goto LAB_00112acb;
                    }
                    uVar22 = 0;
                    auVar38 = vmovdqa64_avx512f(auVar27);
                    auVar39 = vmovdqa64_avx512f(auVar32);
                    do {
                      auVar40 = vpandq_avx512f(auVar38,auVar28);
                      auVar41 = vpandq_avx512f(auVar38,auVar33);
                      auVar42 = vpandq_avx512f(auVar39,auVar28);
                      auVar43 = vpandq_avx512f(auVar39,auVar33);
                      uVar14 = vpcmpuq_avx512f(auVar38,auVar37,2);
                      uVar6 = vpcmpuq_avx512f(auVar39,auVar37,2);
                      auVar38 = vpaddq_avx512f(auVar38,auVar35);
                      auVar39 = vpaddq_avx512f(auVar39,auVar35);
                      auVar40 = vpmuldq_avx512f(auVar40,auVar29);
                      auVar41 = vpaddq_avx512f(auVar36,auVar41);
                      auVar43 = vpaddq_avx512f(auVar36,auVar43);
                      vpaddq_avx512f(auVar41,auVar40);
                      auVar40 = vpmuldq_avx512f(auVar42,auVar29);
                      auVar41 = vpaddq_avx512f(auVar43,auVar40);
                      auVar24 = vpxord_avx512vl(auVar40._0_16_,auVar40._0_16_);
                      auVar25 = vpgatherqd_avx512f(*(undefined8 *)((long)puVar11 + 0x14));
                      bVar1 = (bool)((byte)uVar6 & 1);
                      auVar26._0_4_ = (uint)bVar1 * auVar25._0_4_ | (uint)!bVar1 * auVar24._0_4_;
                      bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
                      auVar26._4_4_ = (uint)bVar1 * auVar25._4_4_ | (uint)!bVar1 * auVar24._4_4_;
                      bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
                      auVar26._8_4_ = (uint)bVar1 * auVar25._8_4_ | (uint)!bVar1 * auVar24._8_4_;
                      bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
                      auVar26._12_4_ = (uint)bVar1 * auVar25._12_4_ | (uint)!bVar1 * auVar24._12_4_;
                      auVar26._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar25._16_4_;
                      auVar26._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar25._20_4_;
                      auVar26._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar25._24_4_;
                      auVar26._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar25._28_4_;
                      auVar24 = vpxord_avx512vl(auVar41._0_16_,auVar41._0_16_);
                      auVar25 = vpgatherqd_avx512f(*(undefined8 *)((long)data + 2));
                      bVar1 = (bool)((byte)uVar14 & 1);
                      bVar2 = (bool)((byte)(uVar14 >> 1) & 1);
                      bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
                      bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
                      auVar40 = vinserti64x4_avx512f
                                          (ZEXT3264(CONCAT428((uint)(byte)(uVar14 >> 7) *
                                                              auVar25._28_4_,
                                                              CONCAT424((uint)((byte)(uVar14 >> 6) &
                                                                              1) * auVar25._24_4_,
                                                                        CONCAT420((uint)((byte)(
                                                  uVar14 >> 5) & 1) * auVar25._20_4_,
                                                  CONCAT416((uint)((byte)(uVar14 >> 4) & 1) *
                                                            auVar25._16_4_,
                                                            CONCAT412((uint)bVar4 * auVar25._12_4_ |
                                                                      (uint)!bVar4 * auVar24._12_4_,
                                                                      CONCAT48((uint)bVar3 *
                                                                               auVar25._8_4_ |
                                                                               (uint)!bVar3 *
                                                                               auVar24._8_4_,
                                                                               CONCAT44((uint)bVar2
                                                                                        * auVar25.
                                                  _4_4_ | (uint)!bVar2 * auVar24._4_4_,
                                                  (uint)bVar1 * auVar25._0_4_ |
                                                  (uint)!bVar1 * auVar24._0_4_)))))))),auVar26,1);
                      auVar40 = vpxord_avx512f(auVar40,auVar34);
                      auVar40 = vmovdqu32_avx512f(auVar40);
                      *(undefined1 (*) [64])(local_c0 + uVar22 * 4 + 8) = auVar40;
                      uVar22 = uVar22 + 0x10;
                    } while ((iVar7 + 0xfU & 0xf0) != uVar22);
                  }
                  pauVar19 = (undefined1 (*) [64])(pauVar20[1] + 8);
                  lVar23 = lVar23 + 1;
                  puVar15 = (undefined8 *)((long)puVar15 + 0x12);
                  *(undefined8 *)pauVar20[1] = uStack_80;
                  auVar38 = vmovdqu64_avx512f(local_c0);
                  auVar38 = vmovdqu64_avx512f(auVar38);
                  *pauVar20 = auVar38;
                  pauVar20 = pauVar19;
                } while (lVar23 != lVar16);
              }
              data = (void *)((long)data + (long)(iVar13 * 4) * 0x12);
              iVar18 = iVar18 + 4;
            } while (iVar18 < iVar9);
          }
          iVar18 = 0;
        }
        return iVar18;
      }
      pcVar12 = "data_size == nrow * nblocks * sizeof(block_q4_0)";
      uVar17 = 0x16ae;
    }
    else {
      pcVar12 = "interleave_block == 4 || interleave_block == 8";
      uVar17 = 0x16a5;
    }
  }
  else {
    pcVar12 = "t->type == GGML_TYPE_Q4_0";
    uVar17 = 0x16a4;
  }
LAB_00112acb:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar17,"GGML_ASSERT(%s) failed",pcVar12);
}

Assistant:

static int repack_q4_0_to_q4_0_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    constexpr int nrows_interleaved = 4;

    block_q4_0x4 * dst = (block_q4_0x4 *)t->data;
    const block_q4_0 * src = (const block_q4_0 *)data;
    block_q4_0 dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}